

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeApplyAffinity(Parse *pParse,int base,int n,char *zAff)

{
  Vdbe *p;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  
  if (zAff == (char *)0x0) {
    return;
  }
  if (0 < n) {
    pcVar5 = zAff + (uint)n;
    iVar4 = n + base;
    do {
      if (*zAff != 'b') goto LAB_00198bef;
      base = base + 1;
      zAff = zAff + 1;
      bVar1 = 1 < n;
      n = n - 1;
    } while (bVar1);
    n = 0;
    zAff = pcVar5;
    base = iVar4;
  }
LAB_00198bef:
  p = pParse->pVdbe;
  uVar3 = (ulong)(uint)n;
  do {
    iVar4 = (int)uVar3;
    if (iVar4 < 2) {
      if (uVar3 != 1) {
        return;
      }
      break;
    }
    lVar2 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while (zAff[lVar2] == 'b');
  sqlite3VdbeAddOp3(p,0x1e,base,iVar4,0);
  sqlite3VdbeChangeP4(p,-1,zAff,iVar4);
  sqlite3ExprCacheRemove(pParse,base,iVar4);
  return;
}

Assistant:

static void codeApplyAffinity(Parse *pParse, int base, int n, char *zAff){
  Vdbe *v = pParse->pVdbe;
  if( zAff==0 ){
    assert( pParse->db->mallocFailed );
    return;
  }
  assert( v!=0 );

  /* Adjust base and n to skip over SQLITE_AFF_NONE entries at the beginning
  ** and end of the affinity string.
  */
  while( n>0 && zAff[0]==SQLITE_AFF_NONE ){
    n--;
    base++;
    zAff++;
  }
  while( n>1 && zAff[n-1]==SQLITE_AFF_NONE ){
    n--;
  }

  /* Code the OP_Affinity opcode if there is anything left to do. */
  if( n>0 ){
    sqlite3VdbeAddOp2(v, OP_Affinity, base, n);
    sqlite3VdbeChangeP4(v, -1, zAff, n);
    sqlite3ExprCacheAffinityChange(pParse, base, n);
  }
}